

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall
SocketReceiveMultiplexer::Implementation::AttachPeriodicTimerListener
          (Implementation *this,int initialDelayMilliseconds,int periodMilliseconds,
          TimerListener *listener)

{
  AttachedTimerListener local_10;
  
  local_10.initialDelayMs = initialDelayMilliseconds;
  local_10.periodMs = periodMilliseconds;
  local_10.listener = listener;
  std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>::
  emplace_back<AttachedTimerListener>(&this->timerListeners_,&local_10);
  return;
}

Assistant:

void AttachPeriodicTimerListener( int initialDelayMilliseconds, int periodMilliseconds, TimerListener *listener )
	{
		timerListeners_.push_back( AttachedTimerListener( initialDelayMilliseconds, periodMilliseconds, listener ) );
	}